

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<Base64Test_DecodeBase64_Test>::CreateTest
          (ParameterizedTestFactory<Base64Test_DecodeBase64_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<Base64TestVector>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006ca598;
  this_00[1]._vptr_Test = (_func_int **)&PTR__Base64Test_DecodeBase64_Test_006ca5d8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }